

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O1

void bfgs_naive(double *H,int N,double eps,double *xi,double *xf,double *jac,double *jacf)

{
  size_t __size;
  double dVar1;
  bool bVar2;
  double *C;
  double *C_00;
  double *C_01;
  double *C_02;
  double *B;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  __size = (long)N * 8;
  C = (double *)malloc(__size);
  C_00 = (double *)malloc(__size);
  C_01 = (double *)malloc(8);
  C_02 = (double *)malloc(8);
  B = (double *)malloc(__size);
  msub(xf,xi,C,1,N);
  msub(jacf,jac,C_00,1,N);
  dVar11 = l2norm(C,N);
  dVar12 = l2norm(C_00,N);
  if (eps < 0.0) {
    dVar13 = sqrt(eps);
  }
  else {
    dVar13 = SQRT(eps);
  }
  bVar2 = true;
  mmult(C_00,C,C_01,1,N,1);
  if (0 < N && dVar12 * dVar11 * dVar13 <= *C_01) {
    uVar10 = (ulong)(uint)N;
    uVar8 = 0;
    uVar4 = uVar10;
    pdVar5 = C;
    pdVar6 = H;
    pdVar7 = H;
    do {
      B[uVar8] = 0.0;
      if (uVar8 != 0) {
        dVar11 = B[uVar8];
        uVar3 = 0;
        pdVar9 = pdVar7;
        do {
          dVar11 = dVar11 + *pdVar9 * C[uVar3];
          uVar3 = uVar3 + 1;
          pdVar9 = pdVar9 + uVar10;
        } while (uVar8 != uVar3);
        B[uVar8] = dVar11;
      }
      dVar11 = B[uVar8];
      uVar3 = 0;
      do {
        dVar11 = dVar11 + pdVar6[uVar3] * pdVar5[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
      B[uVar8] = dVar11;
      dVar12 = jac[uVar8];
      if (jac[uVar8] <= jacf[uVar8]) {
        dVar12 = jacf[uVar8];
      }
      if (dVar12 * dVar13 <= ABS(C_00[uVar8] - dVar11)) {
        bVar2 = false;
      }
      uVar8 = uVar8 + 1;
      pdVar7 = pdVar7 + 1;
      pdVar6 = pdVar6 + uVar10 + 1;
      pdVar5 = pdVar5 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar8 != uVar10);
    if (!bVar2) {
      mmult(C,B,C_02,1,N,1);
      dVar11 = *C_01;
      dVar12 = *C_02;
      uVar8 = 0;
      uVar4 = uVar10;
      pdVar5 = C_00;
      pdVar6 = B;
      do {
        dVar13 = C_00[uVar8];
        dVar1 = B[uVar8];
        uVar3 = 0;
        do {
          dVar14 = (pdVar5[uVar3] * dVar13) / dVar11 + H[uVar3];
          H[uVar3] = dVar14;
          H[uVar3] = dVar14 - (pdVar6[uVar3] * dVar1) / dVar12;
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
        uVar8 = uVar8 + 1;
        H = H + uVar10 + 1;
        pdVar6 = pdVar6 + 1;
        pdVar5 = pdVar5 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar8 != uVar10);
    }
  }
  free(C);
  free(C_00);
  free(C_01);
  free(C_02);
  free(B);
  return;
}

Assistant:

void bfgs_naive(double *H,int N,double eps,double *xi,double *xf,double *jac,double *jacf) {
	int i,j,supd,ct;
	double sn,yn,fd,yt,jacm;
	double *sk,*yk,*temp,*temp2,*t;
	
	sk = (double*) malloc(sizeof(double) *N);
	yk = (double*) malloc(sizeof(double) *N);
	temp = (double*) malloc(sizeof(double) *1);
	temp2 = (double*) malloc(sizeof(double) *1);
	t = (double*) malloc(sizeof(double) *N);
	
	msub(xf,xi,sk,1,N);
	msub(jacf,jac,yk,1,N);
	
	sn = l2norm(sk,N);
	yn = l2norm(yk,N);
	fd = sqrt(eps);
	
	mmult(yk,sk,temp,1,N,1);
	
	if (temp[0] >= fd*sn*yn) {
		supd = 1;
		for(i = 0; i < N;++i) {
			t[i] = 0.0;
			for(j = 0; j < i;++j) {
				ct = j * N;
				t[i] += H[ct+i] * sk[j];
			}
			
			for(j = i; j < N;++j) {
				ct = i * N;
				t[i] += H[ct + j] * sk[j];
			}
			yt = fabs(yk[i] - t[i]);
			if (jac[i] > jacf[i]) {
				jacm = jac[i];
			} else {
				jacm = jacf[i];
			}
			if (yt >= fd * jacm) {
				supd = 0;
			}
		}
		if (supd == 0) {
			mmult(sk,t,temp2,1,N,1);
			for(i = 0;i < N; ++i) {
				ct = i * N;
				for(j = i; j < N;++j) {
					H[ct+j] += (yk[i]*yk[j]/temp[0]);
					H[ct+j] -= (t[i]*t[j]/temp2[0]);
				}
			}
		} 
	} 
	
	free(sk);
	free(yk);
	free(temp);
	free(temp2);
	free(t);
}